

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O2

Ref __thiscall wasm::Wasm2JSBuilder::processWasm(Wasm2JSBuilder *this,Module *wasm,Name funcName)

{
  pointer puVar1;
  Export *pEVar2;
  unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> uVar3;
  char *pcVar4;
  pointer puVar5;
  pointer puVar6;
  __uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_> _Var7;
  unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> imp;
  pointer puVar8;
  Global *pGVar9;
  undefined1 auVar10 [16];
  HeapType type;
  uintptr_t uVar11;
  size_t sVar12;
  Wasm2JSBuilder *this_00;
  bool bVar13;
  char cVar14;
  mapped_type *pmVar15;
  ostream *poVar16;
  undefined8 *puVar17;
  Ref RVar18;
  Ref RVar19;
  Ref RVar20;
  Ref RVar21;
  GlobalGet *pGVar22;
  Return *pRVar23;
  Function *pFVar24;
  byte bVar25;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *extraout_RDX_05;
  char *extraout_RDX_06;
  char *extraout_RDX_07;
  char *extraout_RDX_08;
  char *extraout_RDX_09;
  char *extraout_RDX_10;
  char *extraout_RDX_11;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *exp;
  pointer puVar26;
  Value *pVVar27;
  ulong uVar28;
  pointer puVar29;
  pointer puVar30;
  variant<wasm::Name,_wasm::HeapType> *__v;
  Wasm2JSBuilder *pWVar31;
  Ref in_R8;
  unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> *import;
  uint uVar32;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *import_4;
  Module *pMVar33;
  vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  *__range1;
  IString arg;
  IString name;
  IString name_00;
  IString op;
  IString name_01;
  IString name_02;
  IString op_00;
  IString name_03;
  IString name_04;
  IString name_05;
  IString name_06;
  IString name_07;
  IString name_08;
  IString name_09;
  IString name_10;
  IString name_11;
  IString name_12;
  IString name_13;
  IString name_14;
  IString name_15;
  Name name_16;
  PassOptions local_ad0;
  undefined1 auStack_a18 [8];
  PassRunner runner;
  undefined1 local_818 [280];
  IString local_700;
  IString local_6f0;
  IString local_6e0;
  IString local_6d0;
  IString local_6c0;
  IString local_6b0;
  IString local_6a0;
  IString local_690;
  IString local_680;
  IString local_670;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_660;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_638;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_610;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_5e8;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_5c0;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_598;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_570;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_548;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_520;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4f8;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4d0;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4a8;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_480;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_458;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_430;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_408;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3e0;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3b8;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_390;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_368;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_340;
  string local_318 [32];
  string local_2f8 [32];
  string local_2d8 [32];
  string local_2b8 [32];
  string local_298 [32];
  string local_278 [32];
  string local_258 [32];
  string local_238 [32];
  string local_218 [32];
  string local_1f8 [32];
  string local_1d8 [32];
  string local_1b8 [32];
  string local_198 [32];
  string local_178 [32];
  string local_158 [32];
  string local_138 [32];
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  Value *local_78;
  Ref ret;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> local_60;
  Value *local_58;
  Ref local_50;
  Wasm2JSBuilder *local_48;
  Module *local_40;
  Ref local_38;
  Ref asmFunc;
  
  local_58 = funcName.super_IString.str._M_str;
  puVar1 = (wasm->exports).
           super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar26 = (wasm->exports).
                 super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar26 != puVar1; puVar26 = puVar26 + 1
      ) {
    pEVar2 = (puVar26->_M_t).super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
             ._M_t.super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
             super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
    if (pEVar2->kind == Function) {
      if (*(__index_type *)
           ((long)&(pEVar2->value).super__Variant_base<wasm::Name,_wasm::HeapType> + 0x10) == '\0')
      {
        __v = &pEVar2->value;
      }
      else {
        __v = (variant<wasm::Name,_wasm::HeapType> *)0x0;
      }
      std::__detail::
      _Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::insert((_Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                *)&this->functionsCallableFromOutside,(value_type *)__v);
    }
  }
  local_50.inst =
       (Value *)(wasm->elementSegments).
                super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  local_48 = this;
  local_40 = wasm;
  for (pVVar27 = (Value *)(wasm->elementSegments).
                          super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start; pMVar33 = local_40,
      pWVar31 = local_48, pVVar27 != local_50.inst; pVVar27 = (Value *)&pVVar27->field_1) {
    uVar3._M_t.
    super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>._M_t.
    super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
    super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl =
         *(__uniq_ptr_data<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>,_true,_true>
           *)pVVar27;
    bVar13 = Type::isFunction((Type *)((long)uVar3._M_t.
                                             super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                                             .super__Head_base<0UL,_wasm::ElementSegment_*,_false>.
                                             _M_head_impl + 0x30));
    if (bVar13) {
      uVar32 = 0;
      while( true ) {
        if ((ulong)(*(long *)((long)uVar3._M_t.
                                    super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                                    .super__Head_base<0UL,_wasm::ElementSegment_*,_false>.
                                    _M_head_impl + 0x40) -
                    *(long *)((long)uVar3._M_t.
                                    super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                                    .super__Head_base<0UL,_wasm::ElementSegment_*,_false>.
                                    _M_head_impl + 0x38) >> 3) <= (ulong)uVar32) break;
        pcVar4 = *(char **)(*(long *)((long)uVar3._M_t.
                                            super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                                            .super__Head_base<0UL,_wasm::ElementSegment_*,_false>.
                                            _M_head_impl + 0x38) + (ulong)uVar32 * 8);
        if (*pcVar4 == '+') {
          auStack_a18 = *(undefined1 (*) [8])(pcVar4 + 0x10);
          _runner = *(undefined8 *)(pcVar4 + 0x18);
          std::__detail::
          _Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::insert((_Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    *)&this->functionsCallableFromOutside,(value_type *)auStack_a18);
        }
        uVar32 = uVar32 + 1;
      }
    }
  }
  uVar28 = 0;
  while( true ) {
    pFVar24 = (Function *)
              (pMVar33->dataSegments).
              super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(pMVar33->dataSegments).
                      super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar24 >> 3) <= uVar28)
    break;
    pmVar15 = std::__detail::
              _Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)pWVar31,
                           (key_type *)
                           (&(pFVar24->super_Importable).super_Named.name.super_IString.str._M_len)
                           [uVar28]);
    *pmVar15 = (mapped_type)uVar28;
    uVar28 = (ulong)((mapped_type)uVar28 + 1);
  }
  auVar10._8_8_ = 0;
  auVar10._0_8_ = pFVar24;
  ABI::wasm2js::ensureHelpers((wasm2js *)pMVar33,(Module *)0x0,(IString)(auVar10 << 0x40));
  PassOptions::PassOptions(&local_ad0,&pWVar31->options);
  PassRunner::PassRunner((PassRunner *)auStack_a18,pMVar33,&local_ad0);
  PassOptions::~PassOptions(&local_ad0);
  pMVar33 = local_40;
  if ((pWVar31->flags).emscripten == true) {
    std::__cxx11::string::string<std::allocator<char>>
              (local_318,"llvm-nontrapping-fptoint-lowering",
               (allocator<char> *)&stack0xffffffffffffffc8);
    local_660._M_engaged = false;
    ::wasm::PassRunner::add(auStack_a18,local_318);
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset(&local_660);
    std::__cxx11::string::~string(local_318);
  }
  std::__cxx11::string::string<std::allocator<char>>
            (local_2f8,"legalize-js-interface",(allocator<char> *)&stack0xffffffffffffffc8);
  local_638._M_engaged = false;
  ::wasm::PassRunner::add(auStack_a18,local_2f8);
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset(&local_638);
  std::__cxx11::string::~string(local_2f8);
  if (0 < (pWVar31->options).optimizeLevel) {
    std::__cxx11::string::string<std::allocator<char>>
              (local_2d8,"optimize-for-js",(allocator<char> *)&stack0xffffffffffffffc8);
    local_610._M_engaged = false;
    ::wasm::PassRunner::add(auStack_a18,local_2d8);
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset(&local_610);
    std::__cxx11::string::~string(local_2d8);
  }
  std::__cxx11::string::string<std::allocator<char>>
            (local_2b8,"remove-non-js-ops",(allocator<char> *)&stack0xffffffffffffffc8);
  local_5e8._M_engaged = false;
  ::wasm::PassRunner::add(auStack_a18,local_2b8);
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset(&local_5e8);
  std::__cxx11::string::~string(local_2b8);
  std::__cxx11::string::string<std::allocator<char>>
            (local_298,"flatten",(allocator<char> *)&stack0xffffffffffffffc8);
  local_5c0._M_engaged = false;
  ::wasm::PassRunner::add(auStack_a18,local_298);
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset(&local_5c0);
  std::__cxx11::string::~string(local_298);
  std::__cxx11::string::string<std::allocator<char>>
            (local_278,"i64-to-i32-lowering",(allocator<char> *)&stack0xffffffffffffffc8);
  local_598._M_engaged = false;
  ::wasm::PassRunner::add(auStack_a18,local_278);
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset(&local_598);
  std::__cxx11::string::~string(local_278);
  std::__cxx11::string::string<std::allocator<char>>
            (local_258,"alignment-lowering",(allocator<char> *)&stack0xffffffffffffffc8);
  local_570._M_engaged = false;
  ::wasm::PassRunner::add(auStack_a18,local_258);
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset(&local_570);
  std::__cxx11::string::~string(local_258);
  uVar32 = (pWVar31->options).optimizeLevel;
  if (0 < (int)uVar32) {
    if ((2 < uVar32) || (0 < (pWVar31->options).shrinkLevel)) {
      std::__cxx11::string::string<std::allocator<char>>
                (local_238,"simplify-locals-nonesting",(allocator<char> *)&stack0xffffffffffffffc8);
      local_548._M_engaged = false;
      ::wasm::PassRunner::add(auStack_a18,local_238);
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_reset(&local_548);
      std::__cxx11::string::~string(local_238);
      std::__cxx11::string::string<std::allocator<char>>
                (local_218,"precompute-propagate",(allocator<char> *)&stack0xffffffffffffffc8);
      local_520._M_engaged = false;
      ::wasm::PassRunner::add(auStack_a18,local_218);
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_reset(&local_520);
      std::__cxx11::string::~string(local_218);
      std::__cxx11::string::string<std::allocator<char>>
                (local_1f8,"avoid-reinterprets",(allocator<char> *)&stack0xffffffffffffffc8);
      local_4f8._M_engaged = false;
      ::wasm::PassRunner::add(auStack_a18,local_1f8);
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_reset(&local_4f8);
      std::__cxx11::string::~string(local_1f8);
    }
    ::wasm::PassRunner::addDefaultOptimizationPasses();
    std::__cxx11::string::string<std::allocator<char>>
              (local_1d8,"avoid-reinterprets",(allocator<char> *)&stack0xffffffffffffffc8);
    local_4d0._M_engaged = false;
    ::wasm::PassRunner::add(auStack_a18,local_1d8);
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset(&local_4d0);
    std::__cxx11::string::~string(local_1d8);
  }
  std::__cxx11::string::string<std::allocator<char>>
            (local_1b8,"flatten",(allocator<char> *)&stack0xffffffffffffffc8);
  local_4a8._M_engaged = false;
  ::wasm::PassRunner::add(auStack_a18,local_1b8);
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset(&local_4a8);
  std::__cxx11::string::~string(local_1b8);
  std::__cxx11::string::string<std::allocator<char>>
            (local_198,"simplify-locals-notee-nostructure",
             (allocator<char> *)&stack0xffffffffffffffc8);
  local_480._M_engaged = false;
  ::wasm::PassRunner::add(auStack_a18,local_198);
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset(&local_480);
  std::__cxx11::string::~string(local_198);
  if (0 < (pWVar31->options).optimizeLevel) {
    std::__cxx11::string::string<std::allocator<char>>
              (local_178,"remove-unused-names",(allocator<char> *)&stack0xffffffffffffffc8);
    local_458._M_engaged = false;
    ::wasm::PassRunner::add(auStack_a18,local_178);
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset(&local_458);
    std::__cxx11::string::~string(local_178);
    std::__cxx11::string::string<std::allocator<char>>
              (local_158,"merge-blocks",(allocator<char> *)&stack0xffffffffffffffc8);
    local_430._M_engaged = false;
    ::wasm::PassRunner::add(auStack_a18,local_158);
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset(&local_430);
    std::__cxx11::string::~string(local_158);
    std::__cxx11::string::string<std::allocator<char>>
              (local_138,"reorder-locals",(allocator<char> *)&stack0xffffffffffffffc8);
    local_408._M_engaged = false;
    ::wasm::PassRunner::add(auStack_a18,local_138);
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset(&local_408);
    std::__cxx11::string::~string(local_138);
    std::__cxx11::string::string<std::allocator<char>>
              (local_118,"coalesce-locals",(allocator<char> *)&stack0xffffffffffffffc8);
    local_3e0._M_engaged = false;
    ::wasm::PassRunner::add(auStack_a18,local_118);
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset(&local_3e0);
    std::__cxx11::string::~string(local_118);
  }
  std::__cxx11::string::string<std::allocator<char>>
            (local_f8,"reorder-locals",(allocator<char> *)&stack0xffffffffffffffc8);
  local_3b8._M_engaged = false;
  ::wasm::PassRunner::add(auStack_a18,local_f8);
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset(&local_3b8);
  std::__cxx11::string::~string(local_f8);
  std::__cxx11::string::string<std::allocator<char>>
            (local_d8,"vacuum",(allocator<char> *)&stack0xffffffffffffffc8);
  local_390._M_engaged = false;
  ::wasm::PassRunner::add(auStack_a18,local_d8);
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset(&local_390);
  std::__cxx11::string::~string(local_d8);
  std::__cxx11::string::string<std::allocator<char>>
            (local_b8,"remove-unused-module-elements",(allocator<char> *)&stack0xffffffffffffffc8);
  local_368._M_engaged = false;
  ::wasm::PassRunner::add(auStack_a18,local_b8);
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset(&local_368);
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::string<std::allocator<char>>
            (local_98,"dce",(allocator<char> *)&stack0xffffffffffffffc8);
  local_340._M_engaged = false;
  ::wasm::PassRunner::add(auStack_a18,local_98);
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset(&local_340);
  std::__cxx11::string::~string(local_98);
  ::wasm::PassRunner::run();
  PassRunner::~PassRunner((PassRunner *)auStack_a18);
  if ((pWVar31->flags).symbolsFile._M_string_length != 0) {
    ::wasm::Output::Output((Output *)auStack_a18,(string *)&(pWVar31->flags).symbolsFile,Text);
    puVar5 = (pMVar33->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar29 = (pMVar33->functions).
                   super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar29 != puVar5;
        puVar29 = puVar29 + 1) {
      poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)local_818);
      poVar16 = std::operator<<(poVar16,':');
      pFVar24 = (puVar29->_M_t).
                super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar16,*(char **)((long)&(pFVar24->super_Importable).super_Named + 8),
                           *(long *)&(pFVar24->super_Importable).super_Named);
      std::operator<<(poVar16,'\n');
    }
    Output::~Output((Output *)auStack_a18);
    pMVar33 = local_40;
  }
  cVar14 = ::wasm::WasmValidator::validate((Module *)auStack_a18,(uint)pMVar33);
  if (cVar14 != '\0') {
    local_78 = (Value *)cashew::ValueBuilder::makeToplevel();
    name_03.str._M_str = extraout_RDX;
    name_03.str._M_len = (size_t)local_58;
    local_38 = cashew::ValueBuilder::makeFunction(funcName.super_IString.str._M_len,name_03);
    puVar17 = (undefined8 *)cashew::Ref::operator[]((uint)&local_78);
    cashew::Value::push_back((Value *)*puVar17,local_38);
    arg.str._M_str = (char *)pFVar24;
    arg.str._M_len = DAT_001a5598;
    cashew::ValueBuilder::appendArgumentToFunction((ValueBuilder *)local_38.inst,importObject,arg);
    puVar6 = (pMVar33->memories).
             super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (puVar6 != (pMVar33->memories).
                  super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      if (*(char **)((long)&(((puVar6->_M_t).
                              super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>
                              .super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl)->
                            super_Importable).module + 8) == (char *)0x0) {
        RVar19 = cashew::ValueBuilder::makeVar(false);
        puVar17 = (undefined8 *)cashew::Ref::operator[]((uint)&stack0xffffffffffffffc8);
        cashew::Value::push_back((Value *)*puVar17,RVar19);
        pVVar27 = cashew::LOAD;
        RVar18.inst = BUFFER.inst;
        IString::IString(&local_6b0,"ArrayBuffer");
        name_09.str._M_str = extraout_RDX_05;
        name_09.str._M_len = (size_t)local_6b0.str._M_str;
        RVar20 = cashew::ValueBuilder::makeName((ValueBuilder *)local_6b0.str._M_len,name_09);
        RVar21 = cashew::ValueBuilder::makeInt
                           (*(int *)((long)(((local_40->memories).
                                             super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                           super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>
                                           ._M_t + 0x38) << 0x10);
        RVar20 = cashew::ValueBuilder::makeCall(RVar20,RVar21);
        RVar20 = cashew::ValueBuilder::makeNew(RVar20);
        pMVar33 = local_40;
        name_01.str._M_str = (char *)RVar20.inst;
        name_01.str._M_len = (size_t)pVVar27;
        cashew::ValueBuilder::appendToVar((ValueBuilder *)RVar19.inst,RVar18,name_01,in_R8);
      }
      else {
        uVar32 = (uint)&stack0xffffffffffffffc8;
        puVar17 = (undefined8 *)cashew::Ref::operator[](uVar32);
        pWVar31 = local_48;
        ensureModuleVar(local_48,(Value *)*puVar17,
                        (Importable *)
                        (((pMVar33->memories).
                          super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                        super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t
                       );
        RVar18 = cashew::ValueBuilder::makeVar(false);
        puVar17 = (undefined8 *)cashew::Ref::operator[](uVar32);
        cashew::Value::push_back((Value *)*puVar17,RVar18);
        IString::IString(&local_700,"memory");
        RVar19 = getImportName(pWVar31,(Importable *)
                                       (((local_40->memories).
                                         super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                       super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>
                                       ._M_t);
        name.str._M_str = (char *)RVar19.inst;
        name.str._M_len = (size_t)local_700.str._M_str;
        cashew::ValueBuilder::appendToVar
                  ((ValueBuilder *)RVar18.inst,(Ref)local_700.str._M_len,name,in_R8);
        RVar19 = cashew::ValueBuilder::makeVar(false);
        puVar17 = (undefined8 *)cashew::Ref::operator[](uVar32);
        cashew::Value::push_back((Value *)*puVar17,RVar19);
        RVar18.inst = BUFFER.inst;
        local_50.inst = cashew::LOAD;
        IString::IString(&local_6f0,"memory");
        name_04.str._M_str = extraout_RDX_00;
        name_04.str._M_len = (size_t)local_6f0.str._M_str;
        RVar20 = cashew::ValueBuilder::makeName((ValueBuilder *)local_6f0.str._M_len,name_04);
        IString::IString(&local_6e0,"buffer");
        name_05.str._M_str = extraout_RDX_01;
        name_05.str._M_len = (size_t)local_6e0.str._M_str;
        RVar21 = cashew::ValueBuilder::makeName((ValueBuilder *)local_6e0.str._M_len,name_05);
        pMVar33 = local_40;
        RVar20 = cashew::ValueBuilder::makeDot(RVar20,RVar21);
        name_00.str._M_str = (char *)RVar20.inst;
        name_00.str._M_len = (size_t)local_50.inst;
        cashew::ValueBuilder::appendToVar((ValueBuilder *)RVar19.inst,RVar18,name_00,in_R8);
        _Var7._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
        super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
             (((pMVar33->memories).
               super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_t).
             super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t;
        if (*(ulong *)((long)_Var7._M_t.
                             super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>
                             .super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 0x38) <
            *(ulong *)((long)_Var7._M_t.
                             super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>
                             .super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 0x40)) {
          puVar17 = (undefined8 *)cashew::Ref::operator[]((uint)&stack0xffffffffffffffc8);
          pVVar27 = (Value *)*puVar17;
          IString::IString(&local_6d0,"memory");
          name_06.str._M_str = extraout_RDX_02;
          name_06.str._M_len = (size_t)local_6d0.str._M_str;
          RVar18 = cashew::ValueBuilder::makeName((ValueBuilder *)local_6d0.str._M_len,name_06);
          IString::IString(&local_6c0,"grow");
          name_07.str._M_str = extraout_RDX_03;
          name_07.str._M_len = (size_t)local_6c0.str._M_str;
          RVar19 = cashew::ValueBuilder::makeName((ValueBuilder *)local_6c0.str._M_len,name_07);
          RVar19 = cashew::ValueBuilder::makeDot(RVar18,RVar19);
          sVar12 = BLOCK;
          RVar18.inst = cashew::SET.inst;
          name_08.str._M_str = extraout_RDX_04;
          name_08.str._M_len = _getGCData;
          RVar20 = cashew::ValueBuilder::makeName(WASM_MEMORY_GROW,name_08);
          pMVar33 = local_40;
          op.str._M_str = (char *)RVar20.inst;
          op.str._M_len = sVar12;
          RVar18 = cashew::ValueBuilder::makeBinary(RVar19.inst,RVar18,op,in_R8);
          cashew::Value::push_back(pVVar27,RVar18);
        }
      }
    }
    local_58 = (Value *)(pMVar33->tables).
                        super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
    for (pVVar27 = (Value *)(pMVar33->tables).
                            super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start; pVVar27 != local_58;
        pVVar27 = (Value *)&pVVar27->field_1) {
      imp._M_t.super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t.
      super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
      super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl =
           *(__uniq_ptr_data<wasm::Table,_std::default_delete<wasm::Table>,_true,_true> *)pVVar27;
      if (*(char **)((long)imp._M_t.
                           super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>.
                           _M_t.
                           super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
                           super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl + 0x20) !=
          (char *)0x0) {
        puVar17 = (undefined8 *)cashew::Ref::operator[]((uint)&stack0xffffffffffffffc8);
        pWVar31 = local_48;
        ensureModuleVar(local_48,(Value *)*puVar17,
                        (Importable *)
                        imp._M_t.
                        super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t.
                        super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
                        super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl);
        RVar18 = cashew::ValueBuilder::makeVar(false);
        puVar17 = (undefined8 *)cashew::Ref::operator[]((uint)&stack0xffffffffffffffc8);
        cashew::Value::push_back((Value *)*puVar17,RVar18);
        sVar12 = _isalnum;
        local_50.inst = FUNCTION_TABLE;
        RVar19 = getImportName(pWVar31,(Importable *)
                                       imp._M_t.
                                       super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>
                                       .super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl);
        pMVar33 = local_40;
        name_02.str._M_str = (char *)RVar19.inst;
        name_02.str._M_len = sVar12;
        cashew::ValueBuilder::appendToVar((ValueBuilder *)RVar18.inst,local_50,name_02,in_R8);
      }
    }
    pWVar31 = (Wasm2JSBuilder *)&stack0xffffffffffffffc8;
    uVar32 = (uint)pWVar31;
    puVar17 = (undefined8 *)cashew::Ref::operator[](uVar32);
    addBasics(pWVar31,(Value *)*puVar17,pMVar33);
    puVar5 = (pMVar33->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar29 = (pMVar33->functions).
                   super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar29 != puVar5;
        puVar29 = puVar29 + 1) {
      pFVar24 = (puVar29->_M_t).
                super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      if (*(char **)((long)&(pFVar24->super_Importable).module + 8) != (char *)0x0) {
        puVar17 = (undefined8 *)cashew::Ref::operator[](uVar32);
        addFunctionImport(local_48,(Value *)*puVar17,pFVar24);
      }
    }
    puVar8 = (local_40->globals).
             super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar30 = (local_40->globals).
                   super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pWVar31 = local_48, puVar30 != puVar8;
        puVar30 = puVar30 + 1) {
      pGVar9 = (puVar30->_M_t).
               super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
               super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
      if (*(char **)((long)&(pGVar9->super_Importable).module + 8) != (char *)0x0) {
        puVar17 = (undefined8 *)cashew::Ref::operator[]((uint)&stack0xffffffffffffffc8);
        addGlobalImport(local_48,(Value *)*puVar17,pGVar9);
      }
    }
    puVar5 = (local_40->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar29 = (local_40->functions).
                   super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; this_00 = local_48, puVar29 != puVar5;
        puVar29 = puVar29 + 1) {
      fromName(pWVar31,(IString)*(IString *)
                                 &(((puVar29->_M_t).
                                    super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                    .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl)->
                                  super_Importable).super_Named,Top);
    }
    puVar30 = (local_40->globals).
              super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar8 = (local_40->globals).
             super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_50.inst = local_50.inst & 0xffffffff00000000;
    for (; puVar30 != puVar8; puVar30 = puVar30 + 1) {
      pGVar9 = (puVar30->_M_t).
               super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
               super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
      if (*(char **)((long)&(pGVar9->super_Importable).module + 8) == (char *)0x0) {
        puVar17 = (undefined8 *)cashew::Ref::operator[]((uint)&stack0xffffffffffffffc8);
        addGlobal(this_00,(Value *)*puVar17,pGVar9,local_40);
        RVar18.inst = local_50.inst;
        if ((this_00->flags).allowAsserts == true) {
          bVar25 = (byte)local_50.inst;
          local_50.inst._1_3_ = (int3)((ulong)local_50.inst >> 8);
          local_50.inst._0_1_ =
               bVar25 | *(char **)((long)&(pGVar9->super_Importable).super_Named + 8) == _fprintf;
          local_50.inst._4_4_ = SUB84(RVar18.inst,4);
        }
      }
    }
    if ((local_48->flags).emscripten != false) {
      puVar17 = (undefined8 *)cashew::Ref::operator[]((uint)&stack0xffffffffffffffc8);
      pVVar27 = (Value *)*puVar17;
      IString::IString(&local_6a0,"// EMSCRIPTEN_START_FUNCS\n");
      name_10.str._M_str = extraout_RDX_06;
      name_10.str._M_len = (size_t)local_6a0.str._M_str;
      RVar18 = cashew::ValueBuilder::makeName((ValueBuilder *)local_6a0.str._M_len,name_10);
      cashew::Value::push_back(pVVar27,RVar18);
    }
    puVar5 = (local_40->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar29 = (local_40->functions).
                   super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pMVar33 = local_40, puVar29 != puVar5;
        puVar29 = puVar29 + 1) {
      pFVar24 = (puVar29->_M_t).
                super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      if (*(char **)((long)&(pFVar24->super_Importable).module + 8) == (char *)0x0) {
        puVar17 = (undefined8 *)cashew::Ref::operator[]((uint)&stack0xffffffffffffffc8);
        pVVar27 = (Value *)*puVar17;
        RVar18 = processFunction(local_48,local_40,pFVar24,false);
        cashew::Value::push_back(pVVar27,RVar18);
      }
    }
    if (((ulong)local_50.inst & 1) != 0) {
      puVar17 = (undefined8 *)cashew::Ref::operator[]((uint)&stack0xffffffffffffffc8);
      type.id = EXPRESSION_RESULT.id;
      local_58 = (Value *)*puVar17;
      local_50.inst = (Value *)WASM_FETCH_HIGH_BITS;
      ::wasm::HeapType::HeapType((HeapType *)&ret,(Signature)(ZEXT816(2) << 0x40));
      pcVar4 = _fprintf;
      sVar12 = INT64_TO_32_HIGH_BITS;
      auStack_a18 = (undefined1  [8])0x0;
      _runner = (pointer)0x0;
      pGVar22 = MixedArena::alloc<wasm::GlobalGet>(&pMVar33->allocator);
      (pGVar22->name).super_IString.str._M_len = sVar12;
      (pGVar22->name).super_IString.str._M_str = pcVar4;
      (pGVar22->super_SpecificExpression<(wasm::Expression::Id)10>).super_Expression.type.id = 2;
      pRVar23 = MixedArena::alloc<wasm::Return>(&pMVar33->allocator);
      pRVar23->value = (Expression *)pGVar22;
      in_R8.inst = (Value *)auStack_a18;
      name_16.super_IString.str._M_str = (char *)local_50.inst;
      name_16.super_IString.str._M_len = (size_t)&local_60;
      Builder::makeFunction
                (name_16,type,(vector<wasm::Type,_std::allocator<wasm::Type>_> *)ret.inst,
                 (Expression *)in_R8.inst);
      pMVar33 = local_40;
      pFVar24 = (Function *)::wasm::Module::addFunction((unique_ptr *)local_40);
      RVar18 = processFunction(local_48,pMVar33,pFVar24,false);
      cashew::Value::push_back(local_58,RVar18);
      std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr(&local_60);
      std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
                ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_a18);
      puVar17 = (undefined8 *)operator_new(0x30);
      uVar11 = EXPRESSION_RESULT.id;
      pcVar4 = WASM_FETCH_HIGH_BITS;
      *puVar17 = WASM_FETCH_HIGH_BITS;
      puVar17[1] = uVar11;
      *(undefined4 *)(puVar17 + 2) = 0;
      puVar17[3] = pcVar4;
      puVar17[4] = uVar11;
      *(undefined1 *)(puVar17 + 5) = 0;
      ::wasm::Module::addExport((Export *)pMVar33);
    }
    pWVar31 = local_48;
    if ((local_48->flags).emscripten == true) {
      puVar17 = (undefined8 *)cashew::Ref::operator[]((uint)&stack0xffffffffffffffc8);
      pVVar27 = (Value *)*puVar17;
      IString::IString(&local_690,"// EMSCRIPTEN_END_FUNCS\n");
      name_11.str._M_str = extraout_RDX_07;
      name_11.str._M_len = (size_t)local_690.str._M_str;
      RVar18 = cashew::ValueBuilder::makeName((ValueBuilder *)local_690.str._M_len,name_11);
      cashew::Value::push_back(pVVar27,RVar18);
    }
    bVar13 = needsBufferView(pMVar33);
    if (bVar13) {
      puVar17 = (undefined8 *)cashew::Ref::operator[]((uint)&stack0xffffffffffffffc8);
      pVVar27 = (Value *)*puVar17;
      IString::IString(&local_680,"bufferView");
      name_12.str._M_str = extraout_RDX_08;
      name_12.str._M_len = (size_t)local_680.str._M_str;
      RVar19 = cashew::ValueBuilder::makeName((ValueBuilder *)local_680.str._M_len,name_12);
      sVar12 = BLOCK;
      RVar18.inst = cashew::SET.inst;
      name_13.str._M_str = extraout_RDX_09;
      name_13.str._M_len = _getNumLocals;
      RVar20 = cashew::ValueBuilder::makeName(cashew::HEAPU8,name_13);
      pWVar31 = local_48;
      op_00.str._M_str = (char *)RVar20.inst;
      op_00.str._M_len = sVar12;
      RVar18 = cashew::ValueBuilder::makeBinary(RVar19.inst,RVar18,op_00,in_R8);
      pMVar33 = local_40;
      cashew::Value::push_back(pVVar27,RVar18);
    }
    bVar13 = hasActiveSegments(pMVar33);
    if (bVar13) {
      puVar17 = (undefined8 *)cashew::Ref::operator[]((uint)&stack0xffffffffffffffc8);
      pVVar27 = (Value *)*puVar17;
      IString::IString(&local_670,"initActiveSegments");
      name_14.str._M_str = extraout_RDX_10;
      name_14.str._M_len = (size_t)local_670.str._M_str;
      RVar18 = cashew::ValueBuilder::makeName((ValueBuilder *)local_670.str._M_len,name_14);
      name_15.str._M_str = extraout_RDX_11;
      name_15.str._M_len = DAT_001a5598;
      RVar19 = cashew::ValueBuilder::makeName(importObject.inst,name_15);
      RVar18 = cashew::ValueBuilder::makeCall(RVar18,RVar19);
      pMVar33 = local_40;
      cashew::Value::push_back(pVVar27,RVar18);
    }
    uVar32 = (uint)&stack0xffffffffffffffc8;
    puVar17 = (undefined8 *)cashew::Ref::operator[](uVar32);
    addTable(pWVar31,(Value *)*puVar17,pMVar33);
    puVar17 = (undefined8 *)cashew::Ref::operator[](uVar32);
    addStart(pWVar31,(Value *)*puVar17,pMVar33);
    puVar17 = (undefined8 *)cashew::Ref::operator[](uVar32);
    addExports(pWVar31,(Value *)*puVar17,pMVar33);
    return (Ref)local_78;
  }
  poVar16 = (ostream *)std::operator<<((ostream *)&std::cout,pMVar33);
  std::operator<<(poVar16,'\n');
  Fatal::Fatal((Fatal *)auStack_a18);
  Fatal::operator<<((Fatal *)auStack_a18,(char (*) [35])"error in validating wasm2js output");
  Fatal::~Fatal((Fatal *)auStack_a18);
}

Assistant:

Ref Wasm2JSBuilder::processWasm(Module* wasm, Name funcName) {
  // Scan the wasm for important things.
  for (auto& exp : wasm->exports) {
    if (exp->kind == ExternalKind::Function) {
      functionsCallableFromOutside.insert(*exp->getInternalName());
    }
  }
  ElementUtils::iterAllElementFunctionNames(
    wasm, [&](Name name) { functionsCallableFromOutside.insert(name); });

  // Collect passive data segment indices.
  for (Index i = 0; i < wasm->dataSegments.size(); ++i) {
    dataIndices[wasm->dataSegments[i]->name] = i;
  }

  // Ensure the scratch memory helpers.
  // If later on they aren't needed, we'll clean them up.
  ABI::wasm2js::ensureHelpers(wasm);

  // Process the code, and optimize if relevant.
  // First, do the lowering to a JS-friendly subset.
  {
    PassRunner runner(wasm, options);
    if (flags.emscripten) {
      runner.add("llvm-nontrapping-fptoint-lowering");
    }
    // TODO: only legalize if necessary - emscripten would already do so, and
    //       likely other toolchains. but spec test suite needs that.
    runner.add("legalize-js-interface");
    // Before lowering non-JS operations we can optimize some instructions which
    // may simplify next passes
    if (options.optimizeLevel > 0) {
      runner.add("optimize-for-js");
    }
    // First up remove as many non-JS operations we can, including things like
    // 64-bit integer multiplication/division, `f32.nearest` instructions, etc.
    // This may inject intrinsics which use i64 so it needs to be run before the
    // i64-to-i32 lowering pass.
    runner.add("remove-non-js-ops");
    // Currently the i64-to-32 lowering pass requires that `flatten` be run
    // before it to produce correct code. For some more details about this see
    // #1480
    runner.add("flatten");
    runner.add("i64-to-i32-lowering");
    runner.add("alignment-lowering");
    // Next, optimize that as best we can. This should not generate
    // non-JS-friendly things.
    if (options.optimizeLevel > 0) {
      // It is especially import to propagate constants after the lowering.
      // However, this can be a slow operation, especially after flattening;
      // some local simplification helps.
      if (options.optimizeLevel >= 3 || options.shrinkLevel >= 1) {
        runner.add("simplify-locals-nonesting");
        runner.add("precompute-propagate");
        // Avoiding reinterpretation is helped by propagation. We also run
        // it later down as default optimizations help as well.
        runner.add("avoid-reinterprets");
      }
      runner.addDefaultOptimizationPasses();
      runner.add("avoid-reinterprets");
    }
    // Finally, get the code into the flat form we need for wasm2js itself, and
    // optimize that a little in a way that keeps that property.
    runner.add("flatten");
    // Regardless of optimization level, run some simple optimizations to undo
    // some of the effects of flattening.
    runner.add("simplify-locals-notee-nostructure");
    // Some operations can be very slow if we didn't run full optimizations
    // earlier, so don't run them automatically.
    if (options.optimizeLevel > 0) {
      runner.add("remove-unused-names");
      runner.add("merge-blocks");
      runner.add("reorder-locals");
      runner.add("coalesce-locals");
    }
    runner.add("reorder-locals");
    runner.add("vacuum");
    runner.add("remove-unused-module-elements");
    // DCE at the end to make sure all IR nodes have valid types for conversion
    // to JS, and not unreachable.
    runner.add("dce");
    runner.setDebug(flags.debug);
    runner.run();
  }

  if (flags.symbolsFile.size() > 0) {
    Output out(flags.symbolsFile, wasm::Flags::Text);
    Index i = 0;
    for (auto& func : wasm->functions) {
      out.getStream() << i++ << ':' << func->name.str << '\n';
    }
  }

#ifndef NDEBUG
  if (!WasmValidator().validate(*wasm)) {
    std::cout << *wasm << '\n';
    Fatal() << "error in validating wasm2js output";
  }
#endif

  Ref ret = ValueBuilder::makeToplevel();
  Ref asmFunc = ValueBuilder::makeFunction(funcName);
  ret[1]->push_back(asmFunc);
  ValueBuilder::appendArgumentToFunction(asmFunc, importObject);

  // add memory import
  if (!wasm->memories.empty()) {
    if (wasm->memories[0]->imported()) {
      ensureModuleVar(asmFunc[3], *wasm->memories[0]);

      // find memory and buffer in imports
      Ref theVar = ValueBuilder::makeVar();
      asmFunc[3]->push_back(theVar);
      ValueBuilder::appendToVar(
        theVar, "memory", getImportName(*wasm->memories[0]));

      // Assign `buffer = memory.buffer`
      Ref buf = ValueBuilder::makeVar();
      asmFunc[3]->push_back(buf);
      ValueBuilder::appendToVar(
        buf,
        BUFFER,
        ValueBuilder::makeDot(ValueBuilder::makeName("memory"),
                              ValueBuilder::makeName("buffer")));

      // If memory is growable, override the imported memory's grow method to
      // ensure so that when grow is called from the output it works as expected
      if (wasm->memories[0]->max > wasm->memories[0]->initial) {
        asmFunc[3]->push_back(
          ValueBuilder::makeStatement(ValueBuilder::makeBinary(
            ValueBuilder::makeDot(ValueBuilder::makeName("memory"),
                                  ValueBuilder::makeName("grow")),
            SET,
            ValueBuilder::makeName(WASM_MEMORY_GROW))));
      }
    } else {
      Ref theVar = ValueBuilder::makeVar();
      asmFunc[3]->push_back(theVar);
      ValueBuilder::appendToVar(
        theVar,
        BUFFER,
        ValueBuilder::makeNew(ValueBuilder::makeCall(
          ValueBuilder::makeName("ArrayBuffer"),
          ValueBuilder::makeInt(Address::address32_t(
            wasm->memories[0]->initial.addr * Memory::kPageSize)))));
    }
  }

  // add imported tables
  ModuleUtils::iterImportedTables(*wasm, [&](Table* table) {
    ensureModuleVar(asmFunc[3], *table);
    Ref theVar = ValueBuilder::makeVar();
    asmFunc[3]->push_back(theVar);
    ValueBuilder::appendToVar(theVar, FUNCTION_TABLE, getImportName(*table));
  });

  // create heaps, etc
  addBasics(asmFunc[3], wasm);
  ModuleUtils::iterImportedFunctions(
    *wasm, [&](Function* import) { addFunctionImport(asmFunc[3], import); });
  ModuleUtils::iterImportedGlobals(
    *wasm, [&](Global* import) { addGlobalImport(asmFunc[3], import); });

  // Note the names of functions. We need to do this here as when generating
  // mangled local names we need them not to conflict with these (see fromName)
  // so we can't wait until we parse each function to note its name.
  for (auto& f : wasm->functions) {
    fromName(f->name, NameScope::Top);
  }

  // globals
  bool generateFetchHighBits = false;
  ModuleUtils::iterDefinedGlobals(*wasm, [&](Global* global) {
    addGlobal(asmFunc[3], global, wasm);
    if (flags.allowAsserts && global->name == INT64_TO_32_HIGH_BITS) {
      generateFetchHighBits = true;
    }
  });
  if (flags.emscripten) {
    asmFunc[3]->push_back(
      ValueBuilder::makeName("// EMSCRIPTEN_START_FUNCS\n"));
  }
  // functions
  ModuleUtils::iterDefinedFunctions(*wasm, [&](Function* func) {
    asmFunc[3]->push_back(processFunction(wasm, func));
  });
  if (generateFetchHighBits) {
    Builder builder(*wasm);
    asmFunc[3]->push_back(
      processFunction(wasm,
                      wasm->addFunction(builder.makeFunction(
                        WASM_FETCH_HIGH_BITS,
                        Signature(Type::none, Type::i32),
                        {},
                        builder.makeReturn(builder.makeGlobalGet(
                          INT64_TO_32_HIGH_BITS, Type::i32))))));
    wasm->addExport(new Export(
      WASM_FETCH_HIGH_BITS, ExternalKind::Function, WASM_FETCH_HIGH_BITS));
  }
  if (flags.emscripten) {
    asmFunc[3]->push_back(ValueBuilder::makeName("// EMSCRIPTEN_END_FUNCS\n"));
  }

  if (needsBufferView(*wasm)) {
    asmFunc[3]->push_back(
      ValueBuilder::makeBinary(ValueBuilder::makeName("bufferView"),
                               SET,
                               ValueBuilder::makeName(HEAPU8)));
  }
  if (hasActiveSegments(*wasm)) {
    asmFunc[3]->push_back(
      ValueBuilder::makeCall(ValueBuilder::makeName("initActiveSegments"),
                             ValueBuilder::makeName(importObject)));
  }

  addTable(asmFunc[3], wasm);
  addStart(asmFunc[3], wasm);
  addExports(asmFunc[3], wasm);
  return ret;
}